

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayingState.cpp
# Opt level: O3

void PlayingState::CmdWield
               (string *input,shared_ptr<Connection> *connection,shared_ptr<GameData> *game_data)

{
  pointer pcVar1;
  element_type *name;
  Item *mixin_00;
  undefined8 mixin_01;
  HandType HVar2;
  Wieldable *pWVar3;
  ostream *poVar4;
  Wieldable *pWVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *input_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Base_ptr p_Var7;
  shared_ptr<Player> player;
  shared_ptr<Item> item;
  shared_ptr<Item> main;
  shared_ptr<Item> main_1;
  shared_ptr<Mixin> mixin;
  stringstream ss_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  string match;
  stringstream ss;
  Player *local_738;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_730;
  Item *local_728;
  _Base_ptr local_720;
  Item *local_718;
  _Base_ptr local_710;
  undefined1 local_708 [32];
  shared_ptr<Item> local_6e8;
  shared_ptr<Item> local_6d8;
  shared_ptr<Item> local_6c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6b8;
  shared_ptr<Item> local_6a8;
  shared_ptr<Item> local_698;
  undefined1 local_688 [16];
  shared_ptr<Item> local_678;
  undefined1 local_668 [16];
  undefined1 local_658 [376];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c8;
  undefined1 *local_4b0 [2];
  undefined1 local_4a0 [16];
  undefined1 *local_490 [2];
  undefined1 local_480 [16];
  undefined1 *local_470 [2];
  undefined1 local_460 [16];
  undefined1 *local_450 [2];
  undefined1 local_440 [16];
  string local_430;
  string local_410;
  undefined1 *local_3f0 [2];
  undefined1 local_3e0 [16];
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  string local_2a0;
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  string local_260;
  string local_240;
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  undefined1 *local_200 [2];
  undefined1 local_1f0 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_1e0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  Connection::GetPlayer
            ((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  ItemContainer::GetItems_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)&local_1e0,&local_738->super_ItemContainer);
  Utils::ExtractMapKeys<std::__cxx11::string,int>(&local_4c8,(Utils *)&local_1e0,input_00);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_1e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_4e0,&local_4c8);
  pcVar1 = (input->_M_dataplus)._M_p;
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_430,pcVar1,pcVar1 + input->_M_string_length);
  Utils::FindMatch(&local_410,&local_4e0,&local_430);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4e0);
  name = (game_data->super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_450[0] = local_440;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_450,local_410._M_dataplus._M_p,
             local_410._M_dataplus._M_p + local_410._M_string_length);
  GameData::GetItem((GameData *)&local_728,(string *)name);
  if (local_450[0] != local_440) {
    operator_delete(local_450[0]);
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  mixin_00 = local_728;
  if (local_728 == (Item *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"You do not carry that item!",0x1b)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,Format::NL_abi_cxx11_._M_dataplus._M_p,
               Format::NL_abi_cxx11_._M_string_length);
    std::__cxx11::stringbuf::str();
    (**(local_738->super_Entity)._vptr_Entity)(local_738,local_200);
    if (local_200[0] != local_1f0) {
      operator_delete(local_200[0]);
    }
    goto LAB_0014e9d3;
  }
  local_470[0] = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"Wieldable","");
  MixinContainer::GetMixin((MixinContainer *)local_688,(string *)mixin_00);
  if (local_470[0] != local_460) {
    operator_delete(local_470[0]);
  }
  if (local_688._0_8_ == 0) {
    Item::GetItemName_abi_cxx11_((string *)local_668,local_728);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a0,(char *)local_668._0_8_,local_668._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," can not be wielded!",0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,Format::NL_abi_cxx11_._M_dataplus._M_p,Format::NL_abi_cxx11_._M_string_length)
    ;
    if ((Wieldable *)local_668._0_8_ != (Wieldable *)local_658) {
      operator_delete((void *)local_668._0_8_);
    }
    std::__cxx11::stringbuf::str();
    (**(local_738->super_Entity)._vptr_Entity)(local_738,local_220);
    if (local_220[0] != local_210) {
      operator_delete(local_220[0]);
    }
  }
  else {
    pWVar3 = (Wieldable *)__dynamic_cast(local_688._0_8_,&Mixin::typeinfo,&Wieldable::typeinfo,0);
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (pWVar3 != (Wieldable *)0x0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_688._8_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_688._8_8_;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_688._8_8_ + 8) = *(_Atomic_word *)(local_688._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_688._8_8_ + 8) = *(_Atomic_word *)(local_688._8_8_ + 8) + 1;
        }
      }
    }
    HVar2 = Wieldable::GetHandType(pWVar3);
    switch(HVar2) {
    case MAIN_HAND:
      Player::GetMainHand(local_738);
      std::__cxx11::stringstream::stringstream((stringstream *)local_668);
      if (local_718 != (Item *)0x0) {
        Item::GetItemName_abi_cxx11_(&local_240,local_718);
        ItemContainer::AddItem(&local_738->super_ItemContainer,&local_240);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_658,"Removed ",8);
        Item::GetItemName_abi_cxx11_((string *)local_708,local_718);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_658,(char *)local_708._0_8_,local_708._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,Format::NL_abi_cxx11_._M_dataplus._M_p,
                   Format::NL_abi_cxx11_._M_string_length);
        if ((Item *)local_708._0_8_ != (Item *)(local_708 + 0x10)) {
          operator_delete((void *)local_708._0_8_);
        }
      }
      local_698.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_728;
      local_698.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_720;
      if (local_720 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&local_720->_M_parent = *(int *)&local_720->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&local_720->_M_parent = *(int *)&local_720->_M_parent + 1;
        }
      }
      Player::SetMainHand(local_738,&local_698);
      if ((_Base_ptr)
          local_698.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_698.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
      Item::GetItemName_abi_cxx11_(&local_260,local_728);
      ItemContainer::RemoveItem(&local_738->super_ItemContainer,&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_658,"Wielding ",9);
      Item::GetItemName_abi_cxx11_((string *)local_708,local_728);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_658,(char *)local_708._0_8_,local_708._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,Format::NL_abi_cxx11_._M_dataplus._M_p,
                 Format::NL_abi_cxx11_._M_string_length);
      if ((Item *)local_708._0_8_ != (Item *)(local_708 + 0x10)) {
        operator_delete((void *)local_708._0_8_);
      }
      std::__cxx11::stringbuf::str();
      (**(local_738->super_Entity)._vptr_Entity)(local_738,local_280);
      if (local_280[0] != local_270) {
        operator_delete(local_280[0]);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_668);
      std::ios_base::~ios_base((ios_base *)(local_658 + 0x70));
      local_708._8_8_ = local_710;
      goto LAB_0014e96b;
    case OFF_HAND:
      Player::GetOffHand(local_738);
      Player::GetMainHand(local_738);
      if ((Item *)local_708._0_8_ != (Item *)0x0) {
        Item::GetItemName_abi_cxx11_(&local_2a0,(Item *)local_708._0_8_);
        ItemContainer::AddItem(&local_738->super_ItemContainer,&local_2a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Removed ",8);
        Item::GetItemName_abi_cxx11_((string *)local_668,(Item *)local_708._0_8_);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a0,(char *)local_668._0_8_,local_668._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,Format::NL_abi_cxx11_._M_dataplus._M_p,
                   Format::NL_abi_cxx11_._M_string_length);
        if ((Wieldable *)local_668._0_8_ != (Wieldable *)local_658) {
          operator_delete((void *)local_668._0_8_);
        }
LAB_0014e554:
        local_6a8.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_728;
        local_6a8.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_720;
        if (local_720 != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&local_720->_M_parent = *(int *)&local_720->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&local_720->_M_parent = *(int *)&local_720->_M_parent + 1;
          }
        }
        Player::SetOffHand(local_738,&local_6a8);
        if ((_Base_ptr)
            local_6a8.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_6a8.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        Item::GetItemName_abi_cxx11_(&local_2f0,local_728);
        ItemContainer::RemoveItem(&local_738->super_ItemContainer,&local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Wielding ",9);
        Item::GetItemName_abi_cxx11_((string *)local_668,local_728);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a0,(char *)local_668._0_8_,local_668._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,Format::NL_abi_cxx11_._M_dataplus._M_p,
                   Format::NL_abi_cxx11_._M_string_length);
        goto LAB_0014e72a;
      }
      if (local_718 == (Item *)0x0) goto LAB_0014e554;
      local_490[0] = local_480;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"Wieldable","");
      MixinContainer::GetMixin((MixinContainer *)local_2b0,(string *)local_718);
      std::dynamic_pointer_cast<Wieldable,Mixin>((shared_ptr<Mixin> *)local_668);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_);
      }
      if (local_490[0] != local_480) {
        operator_delete(local_490[0]);
      }
      HVar2 = Wieldable::GetHandType((Wieldable *)local_668._0_8_);
      if (HVar2 != TWO_HAND) {
        if ((_Base_ptr)local_668._8_8_ != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_668._8_8_);
        }
        goto LAB_0014e554;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a0,"Remove two handed weapon before equipping!",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a0,Format::NL_abi_cxx11_._M_dataplus._M_p,
                 Format::NL_abi_cxx11_._M_string_length);
      std::__cxx11::stringbuf::str();
      (**(local_738->super_Entity)._vptr_Entity)(local_738,local_2d0);
      if (local_2d0[0] != local_2c0) {
        operator_delete(local_2d0[0]);
      }
      if ((_Base_ptr)local_668._8_8_ != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_668._8_8_);
      }
      if (local_710 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_710);
      }
      if ((_Base_ptr)local_708._8_8_ != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_708._8_8_);
      }
      goto LAB_0014e9b4;
    case EITHER_HAND:
      Player::GetMainHand(local_738);
      Player::GetOffHand(local_738);
      mixin_01 = local_708._0_8_;
      if ((Item *)local_708._0_8_ == (Item *)0x0) {
        local_6d8.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_728;
        local_6d8.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_720;
        if (local_720 != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&local_720->_M_parent = *(int *)&local_720->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&local_720->_M_parent = *(int *)&local_720->_M_parent + 1;
          }
        }
        Player::SetMainHand(local_738,&local_6d8);
        if ((_Base_ptr)
            local_6d8.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_6d8.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        Item::GetItemName_abi_cxx11_(&local_370,local_728);
        ItemContainer::RemoveItem(&local_738->super_ItemContainer,&local_370);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Wielding ",9);
        Item::GetItemName_abi_cxx11_((string *)local_668,local_728);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a0,(char *)local_668._0_8_,local_668._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," in main hand",0xd);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,Format::NL_abi_cxx11_._M_dataplus._M_p,
                   Format::NL_abi_cxx11_._M_string_length);
        goto LAB_0014e72a;
      }
      local_4b0[0] = local_4a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"Wieldable","");
      MixinContainer::GetMixin((MixinContainer *)local_668,(string *)mixin_01);
      if ((Wieldable *)local_668._0_8_ == (Wieldable *)0x0) {
        pWVar3 = (Wieldable *)0x0;
        p_Var7 = (_Base_ptr)0x0;
      }
      else {
        pWVar5 = (Wieldable *)
                 __dynamic_cast(local_668._0_8_,&Mixin::typeinfo,&Wieldable::typeinfo,0);
        pWVar3 = (Wieldable *)0x0;
        p_Var7 = (_Base_ptr)0x0;
        if (pWVar5 != (Wieldable *)0x0) {
          pWVar3 = pWVar5;
          if ((_Base_ptr)local_668._8_8_ == (_Base_ptr)0x0) {
            p_Var7 = (_Base_ptr)0x0;
          }
          else {
            p_Var7 = (_Base_ptr)local_668._8_8_;
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_668._8_8_ + 8) = *(int *)(local_668._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_668._8_8_ + 8) = *(int *)(local_668._8_8_ + 8) + 1;
            }
          }
        }
      }
      if ((_Base_ptr)local_668._8_8_ != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_668._8_8_);
      }
      if (local_4b0[0] != local_4a0) {
        operator_delete(local_4b0[0]);
      }
      if ((local_718 == (Item *)0x0) && (HVar2 = Wieldable::GetHandType(pWVar3), HVar2 != TWO_HAND))
      {
        local_6b8._M_allocated_capacity = (size_type)local_728;
        local_6b8._8_8_ = local_720;
        if (local_720 != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&local_720->_M_parent = *(int *)&local_720->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&local_720->_M_parent = *(int *)&local_720->_M_parent + 1;
          }
        }
        Player::SetOffHand(local_738,(shared_ptr<Item> *)&local_6b8);
        if ((_Base_ptr)local_6b8._8_8_ != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6b8._8_8_);
        }
        Item::GetItemName_abi_cxx11_(&local_310,local_728);
        ItemContainer::RemoveItem(&local_738->super_ItemContainer,&local_310);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Wielding ",9);
        Item::GetItemName_abi_cxx11_((string *)local_668,local_728);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a0,(char *)local_668._0_8_,local_668._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," in off hand",0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,Format::NL_abi_cxx11_._M_dataplus._M_p,
                   Format::NL_abi_cxx11_._M_string_length);
        if ((Wieldable *)local_668._0_8_ != (Wieldable *)local_658) {
LAB_0014e945:
          operator_delete((void *)local_668._0_8_);
        }
      }
      else {
        local_6c8.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_728;
        local_6c8.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_720;
        if (local_720 != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&local_720->_M_parent = *(int *)&local_720->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&local_720->_M_parent = *(int *)&local_720->_M_parent + 1;
          }
        }
        Player::SetMainHand(local_738,&local_6c8);
        if ((_Base_ptr)
            local_6c8.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_6c8.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        Item::GetItemName_abi_cxx11_(&local_330,local_728);
        ItemContainer::RemoveItem(&local_738->super_ItemContainer,&local_330);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          operator_delete(local_330._M_dataplus._M_p);
        }
        Item::GetItemName_abi_cxx11_(&local_350,(Item *)local_708._0_8_);
        ItemContainer::AddItem(&local_738->super_ItemContainer,&local_350);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          operator_delete(local_350._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Unwielded ",10);
        Item::GetItemName_abi_cxx11_((string *)local_668,(Item *)local_708._0_8_);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a0,(char *)local_668._0_8_,local_668._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,Format::NL_abi_cxx11_._M_dataplus._M_p,
                   Format::NL_abi_cxx11_._M_string_length);
        if ((Wieldable *)local_668._0_8_ != (Wieldable *)local_658) {
          operator_delete((void *)local_668._0_8_);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Wielding ",9);
        Item::GetItemName_abi_cxx11_((string *)local_668,local_728);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a0,(char *)local_668._0_8_,local_668._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," in main hand",0xd);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,Format::NL_abi_cxx11_._M_dataplus._M_p,
                   Format::NL_abi_cxx11_._M_string_length);
        if ((Wieldable *)local_668._0_8_ != (Wieldable *)local_658) goto LAB_0014e945;
      }
      if (p_Var7 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7);
      }
      break;
    case TWO_HAND:
      Player::GetMainHand(local_738);
      Player::GetOffHand(local_738);
      if ((Item *)local_708._0_8_ != (Item *)0x0) {
        Item::GetItemName_abi_cxx11_(&local_390,(Item *)local_708._0_8_);
        ItemContainer::AddItem(&local_738->super_ItemContainer,&local_390);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) {
          operator_delete(local_390._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Unwielded ",10);
        Item::GetItemName_abi_cxx11_((string *)local_668,(Item *)local_708._0_8_);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a0,(char *)local_668._0_8_,local_668._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,Format::NL_abi_cxx11_._M_dataplus._M_p,
                   Format::NL_abi_cxx11_._M_string_length);
        if ((Wieldable *)local_668._0_8_ != (Wieldable *)local_658) {
          operator_delete((void *)local_668._0_8_);
        }
      }
      if (local_718 != (Item *)0x0) {
        Item::GetItemName_abi_cxx11_(&local_3b0,local_718);
        ItemContainer::AddItem(&local_738->super_ItemContainer,&local_3b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
          operator_delete(local_3b0._M_dataplus._M_p);
        }
        local_678.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        local_678.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Player::SetOffHand(local_738,&local_678);
        if ((_Base_ptr)
            local_678.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_678.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Unwielded ",10);
        Item::GetItemName_abi_cxx11_((string *)local_668,local_718);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a0,(char *)local_668._0_8_,local_668._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,Format::NL_abi_cxx11_._M_dataplus._M_p,
                   Format::NL_abi_cxx11_._M_string_length);
        if ((Wieldable *)local_668._0_8_ != (Wieldable *)local_658) {
          operator_delete((void *)local_668._0_8_);
        }
      }
      local_6e8.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_728;
      local_6e8.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_720;
      if (local_720 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&local_720->_M_parent = *(int *)&local_720->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&local_720->_M_parent = *(int *)&local_720->_M_parent + 1;
        }
      }
      Player::SetMainHand(local_738,&local_6e8);
      if ((_Base_ptr)
          local_6e8.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_6e8.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
      Item::GetItemName_abi_cxx11_(&local_3d0,local_728);
      ItemContainer::RemoveItem(&local_738->super_ItemContainer,&local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
        operator_delete(local_3d0._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Wielding ",9);
      Item::GetItemName_abi_cxx11_((string *)local_668,local_728);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a0,(char *)local_668._0_8_,local_668._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," in main hand",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,Format::NL_abi_cxx11_._M_dataplus._M_p,
                 Format::NL_abi_cxx11_._M_string_length);
LAB_0014e72a:
      if ((Wieldable *)local_668._0_8_ != (Wieldable *)local_658) {
        operator_delete((void *)local_668._0_8_);
      }
      break;
    default:
      goto switchD_0014dcf4_default;
    }
    if (local_710 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_710);
    }
LAB_0014e96b:
    if ((_Base_ptr)local_708._8_8_ != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_708._8_8_);
    }
switchD_0014dcf4_default:
    std::__cxx11::stringbuf::str();
    (**(local_738->super_Entity)._vptr_Entity)(local_738,local_3f0);
    if (local_3f0[0] != local_3e0) {
      operator_delete(local_3f0[0]);
    }
LAB_0014e9b4:
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_688._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_688._8_8_);
  }
LAB_0014e9d3:
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  if (local_720 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_720);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4c8);
  if (local_730 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_730);
  }
  return;
}

Assistant:

void PlayingState::CmdWield(const std::string &input, std::shared_ptr<Connection> connection,
                            std::shared_ptr<GameData> game_data) {
    auto player = connection->GetPlayer();
    auto items = Utils::ExtractMapKeys(player->GetItems());
    std::string match = Utils::FindMatch(items, input);
    auto item = game_data->GetItem(match);
    std::stringstream ss;
    if(item == nullptr) {
        ss << "You do not carry that item!" << Format::NL;
        player->Send(ss.str());
        return;
    }
    auto mixin = item->GetMixin("Wieldable");
    if(mixin == nullptr) {
        ss << item->GetItemName() << " can not be wielded!" << Format::NL;
        player->Send(ss.str());
        return;
    }
    auto wieldable = std::dynamic_pointer_cast<Wieldable>(mixin);
    auto hand = wieldable->GetHandType();
    if(hand == MAIN_HAND) {
        auto main = player->GetMainHand();
        std::stringstream ss;
        if (main != nullptr) {
            player->AddItem(main->GetItemName());
            ss << "Removed " << main->GetItemName() << Format::NL;
        }
        player->SetMainHand(item);
        player->RemoveItem(item->GetItemName());
        ss << "Wielding " << item->GetItemName() << Format::NL;
        player->Send(ss.str());
    }
    else if(hand == OFF_HAND) {
        auto off = player->GetOffHand();
        auto main = player->GetMainHand();
        if(off != nullptr) {
            player->AddItem(off->GetItemName());
            ss << "Removed " << off->GetItemName() << Format::NL;
        }
        else if(main != nullptr) {
            auto main_hand = std::dynamic_pointer_cast<Wieldable>(main->GetMixin("Wieldable"));
            if (main_hand->GetHandType() == TWO_HAND) {
                ss << "Remove two handed weapon before equipping!" << Format::NL;
                player->Send(ss.str());
                return;
            }
        }
        player->SetOffHand(item);
        player->RemoveItem(item->GetItemName());
        ss << "Wielding " << item->GetItemName() << Format::NL;
    }
    else if(hand == EITHER_HAND) {
        auto main = player->GetMainHand();
        auto off = player->GetOffHand();
        if(main != nullptr) {
            auto main_hand = std::dynamic_pointer_cast<Wieldable>(main->GetMixin("Wieldable"));
            if(off == nullptr and main_hand->GetHandType() != TWO_HAND) {
                player->SetOffHand(item);
                player->RemoveItem(item->GetItemName());
                ss << "Wielding " << item->GetItemName() << " in off hand" << Format::NL;
            }
            else {
                player->SetMainHand(item);
                player->RemoveItem(item->GetItemName());
                player->AddItem(main->GetItemName());
                ss << "Unwielded " << main->GetItemName() << Format::NL;
                ss << "Wielding " << item->GetItemName() << " in main hand" << Format::NL;
            }
        }
        else {
            player->SetMainHand(item);
            player->RemoveItem(item->GetItemName());
            ss << "Wielding " << item->GetItemName() << " in main hand" << Format::NL;
        }
    }
    else if(hand == TWO_HAND) {
        auto main = player->GetMainHand();
        auto off = player->GetOffHand();
        if(main != nullptr) {
            player->AddItem(main->GetItemName());
            ss << "Unwielded " << main->GetItemName() << Format::NL;
        }
        if(off != nullptr) {
            player->AddItem(off->GetItemName());
            player->SetOffHand(nullptr);
            ss << "Unwielded " << off->GetItemName() << Format::NL;
        }
        player->SetMainHand(item);
        player->RemoveItem(item->GetItemName());
        ss << "Wielding " << item->GetItemName() << " in main hand" << Format::NL;
    }
    player->Send(ss.str());
}